

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O3

int deqp::egl::SurfaceConfig::getCaveatRank(EGLenum caveat)

{
  int iVar1;
  TestError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  code *local_30;
  EGLenum local_28;
  
  if (caveat == 0x3038) {
    iVar1 = 0;
  }
  else if (caveat == 0x3051) {
    iVar1 = 2;
  }
  else {
    if (caveat != 0x3050) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Unknown config caveat: ","");
      local_30 = eglu::getConfigCaveatName;
      local_28 = caveat;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_30);
      std::operator+(&local_50,&local_90,&local_70);
      tcu::TestError::TestError
                (this,local_50._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,100);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int getCaveatRank (EGLenum caveat)
	{
		switch (caveat)
		{
			case EGL_NONE:					return 0;
			case EGL_SLOW_CONFIG:			return 1;
			case EGL_NON_CONFORMANT_CONFIG:	return 2;
			default:
				TCU_THROW(TestError, (std::string("Unknown config caveat: ") + eglu::getConfigCaveatStr(caveat).toString()).c_str());
		}
	}